

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrHandTrackingAimStateFB *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  bool bVar2;
  XrInstance pXVar3;
  invalid_argument *piVar4;
  XrGeneratedDispatchTable *gen_dispatch_table_00;
  string type_prefix;
  string pinchstrengthlittle_prefix;
  string pinchstrengthring_prefix;
  string pinchstrengthmiddle_prefix;
  string pinchstrengthindex_prefix;
  string aimpose_prefix;
  string status_prefix;
  string next_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_698;
  undefined1 local_678 [32];
  string local_658;
  string local_638;
  ostringstream oss_pinchStrengthIndex;
  PFN_xrDestroySession p_Stack_610;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_608;
  PFN_xrGetReferenceSpaceBoundsRect local_5f8;
  PFN_xrCreateActionSpace p_Stack_5f0;
  PFN_xrLocateSpace local_5e8;
  PFN_xrDestroySpace p_Stack_5e0;
  ostringstream oss_pinchStrengthLittle;
  undefined8 local_490 [46];
  ostringstream oss_pinchStrengthRing;
  undefined8 local_318 [46];
  ostringstream oss_pinchStrengthMiddle;
  undefined8 local_1a0 [46];
  
  PointerToHexString<XrHandTrackingAimStateFB>
            ((XrHandTrackingAimStateFB *)type_prefix._M_dataplus._M_p);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &oss_pinchStrengthIndex);
  std::__cxx11::string::~string((string *)&oss_pinchStrengthIndex);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_pinchStrengthIndex,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_pinchStrengthIndex);
    std::__cxx11::string::~string((string *)&oss_pinchStrengthIndex);
  }
  else {
    local_5e8 = (PFN_xrLocateSpace)0x0;
    p_Stack_5e0 = (PFN_xrDestroySpace)0x0;
    local_5f8 = (PFN_xrGetReferenceSpaceBoundsRect)0x0;
    p_Stack_5f0 = (PFN_xrCreateActionSpace)0x0;
    local_608._M_allocated_capacity = 0;
    local_608._8_8_ = 0;
    _oss_pinchStrengthIndex = (pointer)0x0;
    p_Stack_610 = (PFN_xrDestroySession)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar3,value->type,(char *)&oss_pinchStrengthIndex);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (char (*) [64])&oss_pinchStrengthIndex);
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_638,(string *)&next_prefix);
  bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_638,contents);
  std::__cxx11::string::~string((string *)&local_638);
  if (bVar2) {
    std::__cxx11::string::string((string *)&status_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&status_prefix);
    std::__cxx11::to_string((string *)&oss_pinchStrengthIndex,value->status);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[25],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [25])"XrHandTrackingAimFlagsFB",&status_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_pinchStrengthIndex);
    std::__cxx11::string::~string((string *)&oss_pinchStrengthIndex);
    std::__cxx11::string::string((string *)&aimpose_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&aimpose_prefix);
    std::__cxx11::string::string((string *)(local_678 + 0x20),(string *)&aimpose_prefix);
    gen_dispatch_table_00 = (XrGeneratedDispatchTable *)local_678;
    std::__cxx11::string::string
              ((string *)gen_dispatch_table_00,"XrPosef",(allocator *)&oss_pinchStrengthIndex);
    bVar2 = ApiDumpOutputXrStruct
                      (gen_dispatch_table_00,&value->aimPose,(string *)(local_678 + 0x20),
                       (string *)local_678,false,contents);
    std::__cxx11::string::~string((string *)local_678);
    std::__cxx11::string::~string((string *)(local_678 + 0x20));
    if (bVar2) {
      std::__cxx11::string::string((string *)&pinchstrengthindex_prefix,(string *)prefix);
      std::__cxx11::string::append((char *)&pinchstrengthindex_prefix);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_pinchStrengthIndex);
      *(undefined8 *)((long)&p_Stack_610 + *(long *)(_oss_pinchStrengthIndex + -0x18)) = 0x20;
      std::ostream::operator<<((ostream *)&oss_pinchStrengthIndex,value->pinchStrengthIndex);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [6])"float",&pinchstrengthindex_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &oss_pinchStrengthMiddle);
      std::__cxx11::string::~string((string *)&oss_pinchStrengthMiddle);
      std::__cxx11::string::string((string *)&pinchstrengthmiddle_prefix,(string *)prefix);
      std::__cxx11::string::append((char *)&pinchstrengthmiddle_prefix);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_pinchStrengthMiddle);
      *(undefined8 *)((long)local_1a0 + *(long *)(_oss_pinchStrengthMiddle + -0x18)) = 0x20;
      std::ostream::operator<<((ostream *)&oss_pinchStrengthMiddle,value->pinchStrengthMiddle);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [6])"float",&pinchstrengthmiddle_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &oss_pinchStrengthRing);
      std::__cxx11::string::~string((string *)&oss_pinchStrengthRing);
      std::__cxx11::string::string((string *)&pinchstrengthring_prefix,(string *)prefix);
      std::__cxx11::string::append((char *)&pinchstrengthring_prefix);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_pinchStrengthRing);
      *(undefined8 *)((long)local_318 + *(long *)(_oss_pinchStrengthRing + -0x18)) = 0x20;
      std::ostream::operator<<((ostream *)&oss_pinchStrengthRing,value->pinchStrengthRing);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [6])"float",&pinchstrengthring_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &oss_pinchStrengthLittle);
      std::__cxx11::string::~string((string *)&oss_pinchStrengthLittle);
      std::__cxx11::string::string((string *)&pinchstrengthlittle_prefix,(string *)prefix);
      std::__cxx11::string::append((char *)&pinchstrengthlittle_prefix);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_pinchStrengthLittle);
      *(undefined8 *)((long)local_490 + *(long *)(_oss_pinchStrengthLittle + -0x18)) = 0x20;
      std::ostream::operator<<((ostream *)&oss_pinchStrengthLittle,value->pinchStrengthLittle);
      std::__cxx11::stringbuf::str();
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,(char (*) [6])"float",&pinchstrengthlittle_prefix,&local_698);
      std::__cxx11::string::~string((string *)&local_698);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_pinchStrengthLittle);
      std::__cxx11::string::~string((string *)&pinchstrengthlittle_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_pinchStrengthRing);
      std::__cxx11::string::~string((string *)&pinchstrengthring_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_pinchStrengthMiddle);
      std::__cxx11::string::~string((string *)&pinchstrengthmiddle_prefix);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_pinchStrengthIndex);
      std::__cxx11::string::~string((string *)&pinchstrengthindex_prefix);
      std::__cxx11::string::~string((string *)&aimpose_prefix);
      std::__cxx11::string::~string((string *)&status_prefix);
      std::__cxx11::string::~string((string *)&next_prefix);
      std::__cxx11::string::~string((string *)&type_prefix);
      return true;
    }
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Invalid Operation");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar4,"Invalid Operation");
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrHandTrackingAimStateFB* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string status_prefix = prefix;
        status_prefix += "status";
        contents.emplace_back("XrHandTrackingAimFlagsFB", status_prefix, std::to_string(value->status));
        std::string aimpose_prefix = prefix;
        aimpose_prefix += "aimPose";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->aimPose, aimpose_prefix, "XrPosef", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string pinchstrengthindex_prefix = prefix;
        pinchstrengthindex_prefix += "pinchStrengthIndex";
        std::ostringstream oss_pinchStrengthIndex;
        oss_pinchStrengthIndex << std::setprecision(32) << (value->pinchStrengthIndex);
        contents.emplace_back("float", pinchstrengthindex_prefix, oss_pinchStrengthIndex.str());
        std::string pinchstrengthmiddle_prefix = prefix;
        pinchstrengthmiddle_prefix += "pinchStrengthMiddle";
        std::ostringstream oss_pinchStrengthMiddle;
        oss_pinchStrengthMiddle << std::setprecision(32) << (value->pinchStrengthMiddle);
        contents.emplace_back("float", pinchstrengthmiddle_prefix, oss_pinchStrengthMiddle.str());
        std::string pinchstrengthring_prefix = prefix;
        pinchstrengthring_prefix += "pinchStrengthRing";
        std::ostringstream oss_pinchStrengthRing;
        oss_pinchStrengthRing << std::setprecision(32) << (value->pinchStrengthRing);
        contents.emplace_back("float", pinchstrengthring_prefix, oss_pinchStrengthRing.str());
        std::string pinchstrengthlittle_prefix = prefix;
        pinchstrengthlittle_prefix += "pinchStrengthLittle";
        std::ostringstream oss_pinchStrengthLittle;
        oss_pinchStrengthLittle << std::setprecision(32) << (value->pinchStrengthLittle);
        contents.emplace_back("float", pinchstrengthlittle_prefix, oss_pinchStrengthLittle.str());
        return true;
    } catch(...) {
    }
    return false;
}